

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask11_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long unaff_RBP;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x5c5044382c201408));
  uVar1 = in[0x1f];
  auVar10 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[0xf] << 5)));
  vpmovsxbd_avx(ZEXT416(0x3024180c));
  auVar7 = vpsrlvd_avx2(auVar10._0_16_,_DAT_0019b3e0);
  auVar6 = vpsllvd_avx2(auVar10,_DAT_00197c80);
  auVar9 = vpshufd_avx(auVar10._16_16_,0xe9);
  auVar8 = vpsrlvd_avx2(auVar9,_DAT_0019b400);
  auVar9 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[0xf] << 5)));
  auVar9 = vpsllvd_avx2(auVar9,_DAT_00199e60);
  uVar2 = in[0x1a];
  auVar9 = vpor_avx(auVar9,auVar7);
  auVar11 = valignd_avx512vl(ZEXT1632(auVar9),ZEXT1632(auVar9),7);
  auVar9 = vpinsrd_avx(ZEXT416(in[0x12]),in[0x15],1);
  auVar9 = vpsllvd_avx2(auVar9,_DAT_00199e70);
  auVar9 = vpor_avx(auVar9,auVar8);
  vpmovsxbd_avx2(ZEXT816(0x584c4034281c1004));
  auVar14._0_8_ = auVar9._0_8_;
  auVar14._8_8_ = auVar14._0_8_;
  auVar14._16_8_ = auVar14._0_8_;
  auVar14._24_8_ = auVar14._0_8_;
  auVar12 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBP));
  auVar12 = vpsllvd_avx2(auVar12,_DAT_00197c40);
  auVar11 = vpblendd_avx2(auVar11,ZEXT432(*in),1);
  auVar13 = vpbroadcastd_avx512vl();
  uVar3 = in[0x1d];
  auVar11 = vpblendd_avx2(auVar11,auVar13,0x20);
  auVar11 = vpblendd_avx2(auVar11,auVar14,0xc0);
  auVar11 = vpternlogd_avx512vl(auVar6,auVar12,auVar11,0xfe);
  uVar4 = in[0x18];
  auVar9 = vpshufd_avx(auVar10._16_16_,0xff);
  auVar9 = vpinsrd_avx(auVar9,uVar2,1);
  auVar7 = vpsrlvd_avx2(auVar9,_DAT_00199e30);
  *(undefined1 (*) [32])out = auVar11;
  uVar5 = in[0x1e];
  auVar9 = vpinsrd_avx(ZEXT416(uVar2),uVar3,1);
  auVar8 = vpsllvd_avx2(auVar9,_DAT_0019ae90);
  auVar9 = vpinsrd_avx(ZEXT416(uVar4),in[0x1b],1);
  auVar9 = vpsllvd_avx2(auVar9,_DAT_0019b430);
  auVar7 = vpor_avx(auVar9,auVar7);
  auVar9 = vpinsrd_avx(ZEXT416(in[0x19]),in[0x1c],1);
  auVar9 = vpsllvd_avx2(auVar9,_DAT_0019b450);
  auVar9 = vpternlogd_avx512vl(auVar8,auVar9,auVar7,0xfe);
  *(long *)(out + 8) = auVar9._0_8_;
  out[10] = uVar1 << 0x15 | uVar5 << 10 | uVar3 >> 1;
  return out + 0xb;
}

Assistant:

uint32_t *__fastpackwithoutmask11_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (11 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (11 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (11 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (11 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (11 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (11 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (11 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (11 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 19;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (11 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (11 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  ++in;

  return out;
}